

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetFieldOverride(ON_DimStyle *this,field field_id,bool bOverrideParent)

{
  uint uVar1;
  int iVar2;
  ON__UINT32 *pOVar3;
  ulong uStack_18;
  ON__UINT32 mask;
  
  if ((field_id - ExtensionLineExtension < 0x70) &&
     (this->m_field_override_parent_count != 0 || bOverrideParent)) {
    uStack_18 = (ulong)(field_id - ExtensionLineExtension);
    pOVar3 = Internal_GetOverrideParentBit(this,field_id,&mask);
    if (pOVar3 != (ON__UINT32 *)0x0) {
      uVar1 = *pOVar3;
      if (bOverrideParent) {
        *pOVar3 = mask | uVar1;
        if ((mask | uVar1) == uVar1) {
          return;
        }
        iVar2 = 1;
      }
      else {
        *pOVar3 = ~mask & uVar1;
        if ((~mask & uVar1) == uVar1) {
          return;
        }
        iVar2 = -1;
      }
      this->m_field_override_parent_count = this->m_field_override_parent_count + iVar2;
      Internal_ContentChange(this);
    }
  }
  return;
}

Assistant:

void ON_DimStyle::SetFieldOverride(ON_DimStyle::field field_id, bool bOverrideParent)
{
  // Note well:
  //   The Name and Index properties cannot be inherited from a parent dimension style.
  if (
    static_cast<unsigned int>(field_id) > static_cast<unsigned int>(ON_DimStyle::field::Index)
    && static_cast<unsigned int>(field_id) < static_cast<unsigned int>(ON_DimStyle::field::Count)
    && (m_field_override_parent_count > 0 || bOverrideParent)
    )
  {
    ON__UINT32 mask = 0;
    ON__UINT32* bits = Internal_GetOverrideParentBit(field_id, &mask);
    if (nullptr != bits)
    {
      const ON__UINT32 bits0 = *bits;
      if (bOverrideParent)
      {
        // field_id bit = 1 indicates the field value is independent of the parent.
        *bits |= mask;
        if (*bits != bits0)
        {
          m_field_override_parent_count++;
          Internal_ContentChange();
        }
      }
      else
      {
        // field_id bit = 0 indicates the field value is inherited from the parent.
        *bits &= ~mask;
        if (*bits != bits0)
        {
          m_field_override_parent_count--;
          Internal_ContentChange();
        }
      }
    }
  }
}